

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<int>::PrepareZ
          (TPZMatrix<int> *this,TPZFMatrix<int> *y,TPZFMatrix<int> *z,int beta,int opt)

{
  int64_t iVar1;
  int *piVar2;
  int in_ECX;
  TPZFMatrix<int> *in_RDX;
  TPZFMatrix<int> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  int64_t i;
  int *yp;
  int *zlast;
  int *zp;
  int64_t ic;
  int64_t xcols;
  int64_t numeq;
  long local_68;
  long in_stack_ffffffffffffffa8;
  TPZFMatrix<int> *in_stack_ffffffffffffffb0;
  int *local_40;
  long local_38;
  
  if (in_R8D == 0) {
    local_68 = TPZBaseMatrix::Rows(in_RDI);
  }
  else {
    local_68 = TPZBaseMatrix::Cols(in_RDI);
  }
  iVar1 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  (*(in_RDX->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (in_RDX,local_68,iVar1);
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    local_40 = TPZFMatrix<int>::operator()
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int64_t)in_RDI);
    piVar2 = local_40 + local_68;
    if (in_ECX == 0) {
      for (; local_40 != piVar2; local_40 = local_40 + 1) {
        *local_40 = 0;
      }
    }
    else {
      in_stack_ffffffffffffffb0 = (TPZFMatrix<int> *)TPZFMatrix<int>::g(in_RSI,0,local_38);
      if (in_RDX != in_RSI) {
        memcpy(local_40,in_stack_ffffffffffffffb0,local_68 << 2);
      }
      for (in_stack_ffffffffffffffa8 = 0; in_stack_ffffffffffffffa8 < local_68;
          in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
        piVar2 = TPZFMatrix<int>::operator()
                           (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int64_t)in_RDI);
        *piVar2 = in_ECX * *piVar2;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}